

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::InitializeIntlForStringPrototype(JavascriptLibrary *this)

{
  anon_class_1_0_00000001 stringPrototypeInitializer;
  JavascriptLibrary *this_local;
  
  InitializeIntlForPrototypes<Js::JavascriptLibrary::InitializeIntlForStringPrototype()::__0>(this);
  return;
}

Assistant:

void JavascriptLibrary::InitializeIntlForStringPrototype()
    {
        auto stringPrototypeInitializer = [&](IntlEngineInterfaceExtensionObject* intlExtension, ScriptContext * scriptContext, DynamicObject* intlObject) ->void
        {
            intlExtension->InjectIntlLibraryCode(scriptContext, intlObject, IntlInitializationType::StringPrototype);
        };
        InitializeIntlForPrototypes(stringPrototypeInitializer);
    }